

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaTruth.c
# Opt level: O1

Gia_Man_t * Gia_ManIsoNpnReduce(Gia_Man_t *p,Vec_Ptr_t **pvPosEquivs,int fVerbose)

{
  ulong *puVar1;
  Gia_Obj_t *pGVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  word wVar6;
  Vec_Mem_t *p_00;
  void *pvVar7;
  uint uVar8;
  Vec_Wec_t *p_01;
  Vec_Int_t *pVVar9;
  int *piVar10;
  uint *puVar11;
  void *pvVar12;
  undefined8 *puVar13;
  Vec_Int_t *pVVar14;
  word *pTruth;
  ulong uVar15;
  word **ppwVar16;
  word *pwVar17;
  Gia_Man_t *pGVar18;
  Vec_Ptr_t *pVVar19;
  void **__ptr;
  byte bVar20;
  int iVar21;
  word *pwVar22;
  uint uVar23;
  int iVar24;
  uint uVar25;
  ulong uVar26;
  long lVar27;
  uint uVar28;
  size_t __size;
  uint *pLimitU;
  word *tLimit;
  ulong uVar29;
  uint uVar30;
  ulong uVar31;
  int iVar32;
  int iVar33;
  uint uVar34;
  ulong uVar35;
  word *pwVar36;
  long lVar37;
  long lVar38;
  bool bVar39;
  bool bVar40;
  int iObj;
  char pCanonPerm [16];
  Vec_Int_t *vTt2Class [17];
  Vec_Mem_t *vTtMem [17];
  int local_164;
  Vec_Ptr_t **local_160;
  char local_158 [16];
  long alStack_148 [18];
  undefined8 auStack_b8 [17];
  
  local_160 = pvPosEquivs;
  p_01 = (Vec_Wec_t *)malloc(0x10);
  p_01->nCap = 100;
  p_01->nSize = 0;
  pVVar9 = (Vec_Int_t *)calloc(100,0x10);
  p_01->pArray = pVVar9;
  pVVar9 = (Vec_Int_t *)malloc(0x10);
  pVVar9->nCap = 0x10;
  pVVar9->nSize = 0;
  piVar10 = (int *)malloc(0x40);
  pVVar9->pArray = piVar10;
  uVar31 = 0;
  do {
    iVar21 = 1 << ((char)uVar31 - 6U & 0x1f);
    if (uVar31 < 7) {
      iVar21 = 1;
    }
    piVar10 = (int *)calloc(1,0x30);
    *piVar10 = iVar21;
    piVar10[2] = 10;
    piVar10[3] = 0x3ff;
    piVar10[5] = -1;
    auStack_b8[uVar31] = piVar10;
    if ((*(long *)(piVar10 + 8) != 0) || (*(long *)(piVar10 + 10) != 0)) {
      __assert_fail("p->vTable == NULL && p->vNexts == NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecMem.h"
                    ,0x13b,"void Vec_MemHashAlloc(Vec_Mem_t *, int)");
    }
    uVar25 = 999;
    while( true ) {
      do {
        uVar34 = uVar25;
        uVar25 = uVar34 + 1;
      } while ((uVar34 & 1) != 0);
      if (uVar25 < 9) break;
      iVar21 = 5;
      while (uVar25 % (iVar21 - 2U) != 0) {
        uVar8 = iVar21 * iVar21;
        iVar21 = iVar21 + 2;
        if (uVar25 < uVar8) goto LAB_0023bae4;
      }
    }
LAB_0023bae4:
    puVar11 = (uint *)malloc(0x10);
    uVar8 = uVar25;
    if (uVar34 < 0xf) {
      uVar8 = 0x10;
    }
    puVar11[1] = 0;
    *puVar11 = uVar8;
    pvVar12 = malloc((long)(int)uVar8 << 2);
    *(void **)(puVar11 + 2) = pvVar12;
    puVar11[1] = uVar25;
    if (pvVar12 != (void *)0x0) {
      memset(pvVar12,0xff,(long)(int)uVar25 << 2);
    }
    *(uint **)(piVar10 + 8) = puVar11;
    puVar13 = (undefined8 *)malloc(0x10);
    *puVar13 = 1000;
    pvVar12 = malloc(4000);
    puVar13[1] = pvVar12;
    *(undefined8 **)(piVar10 + 10) = puVar13;
    uVar35 = (ulong)p->vCos->nSize;
    lVar37 = uVar35 + 1;
    piVar10 = (int *)malloc(0x10);
    iVar32 = (int)lVar37;
    iVar21 = iVar32;
    if (uVar35 < 0xf) {
      iVar21 = 0x10;
    }
    piVar10[1] = 0;
    *piVar10 = iVar21;
    if (iVar21 == 0) {
      pvVar12 = (void *)0x0;
    }
    else {
      pvVar12 = malloc((long)iVar21 << 2);
    }
    *(void **)(piVar10 + 2) = pvVar12;
    piVar10[1] = iVar32;
    if (pvVar12 != (void *)0x0) {
      memset(pvVar12,0xff,lVar37 * 4);
    }
    alStack_148[uVar31] = (long)piVar10;
    uVar31 = uVar31 + 1;
  } while (uVar31 != 0x11);
  Gia_ObjComputeTruthTableStart(p,0x10);
  pVVar14 = p->vCos;
  uVar31 = (ulong)(uint)pVVar14->nSize;
  if (p->nRegs < pVVar14->nSize) {
    uVar25 = 0xffffffff;
    lVar37 = 0;
    uVar34 = 0xffffffff;
    do {
      if ((int)uVar31 <= lVar37) {
LAB_0023cac3:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      iVar21 = pVVar14->pArray[lVar37];
      if (((long)iVar21 < 0) || (p->nObjs <= iVar21)) {
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      pGVar2 = p->pObjs;
      if (pGVar2 == (Gia_Obj_t *)0x0) break;
      local_164 = iVar21;
      Gia_ManCollectCis(p,&local_164,1,pVVar9);
      if (pVVar9->nSize < 0x11) {
        pGVar2 = pGVar2 + iVar21;
        uVar31 = (ulong)((uint)*(undefined8 *)pGVar2 & 0x1fffffff);
        if ((~*(ulong *)(pGVar2 + -uVar31) & 0x1fffffff1fffffff) == 0) {
          if (uVar25 == 0xffffffff) {
            uVar25 = p_01->nSize;
            Vec_WecPushLevel(p_01);
          }
          if (p_01->nSize <= (int)uVar25) {
            iVar32 = uVar25 + 1;
            iVar21 = p_01->nSize * 2;
            if (iVar21 <= iVar32) {
              iVar21 = iVar32;
            }
            iVar33 = p_01->nCap;
            if (iVar33 < iVar21) {
              if (p_01->pArray == (Vec_Int_t *)0x0) {
                pVVar14 = (Vec_Int_t *)malloc((long)iVar21 << 4);
              }
              else {
                pVVar14 = (Vec_Int_t *)realloc(p_01->pArray,(long)iVar21 << 4);
              }
              p_01->pArray = pVVar14;
              memset(pVVar14 + iVar33,0,(long)(iVar21 - iVar33) << 4);
              p_01->nCap = iVar21;
            }
            p_01->nSize = iVar32;
          }
          if (((int)uVar25 < 0) || (uVar8 = uVar25, p_01->nSize <= (int)uVar25)) goto LAB_0023cae2;
        }
        else {
          uVar8 = (uint)*(ulong *)(pGVar2 + -uVar31);
          if ((~uVar8 & 0x9fffffff) == 0) {
            if (uVar34 == 0xffffffff) {
              uVar34 = p_01->nSize;
              Vec_WecPushLevel(p_01);
            }
            iVar21 = p_01->nSize;
            if (iVar21 <= (int)uVar34) {
LAB_0023c19c:
              iVar33 = uVar34 + 1;
              iVar32 = iVar21 * 2;
              if (iVar21 * 2 <= iVar33) {
                iVar32 = iVar33;
              }
              iVar21 = p_01->nCap;
              if (iVar21 < iVar32) {
                if (p_01->pArray == (Vec_Int_t *)0x0) {
                  pVVar14 = (Vec_Int_t *)malloc((long)iVar32 << 4);
                }
                else {
                  pVVar14 = (Vec_Int_t *)realloc(p_01->pArray,(long)iVar32 << 4);
                }
                p_01->pArray = pVVar14;
                memset(pVVar14 + iVar21,0,(long)(iVar32 - iVar21) << 4);
                p_01->nCap = iVar32;
              }
              p_01->nSize = iVar33;
            }
          }
          else {
            if (((int)uVar8 < 0) || ((uVar8 & 0x1fffffff) == 0x1fffffff)) {
              __assert_fail("Gia_ObjIsAnd(pObj)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaTruth.c"
                            ,0x2f7,"Gia_Man_t *Gia_ManIsoNpnReduce(Gia_Man_t *, Vec_Ptr_t **, int)")
              ;
            }
            pTruth = Gia_ObjComputeTruthTableCut(p,pGVar2 + -uVar31,pVVar9);
            iVar21 = pVVar9->nSize;
            uVar31 = (ulong)iVar21;
            if (0x10 < (long)uVar31) {
              __assert_fail("nVarsAll <= 16",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/utilTruth.h"
                            ,0x6ec,"int Abc_TtMinimumBase(word *, int *, int, int *)");
            }
            if (iVar21 < 1) {
              iVar32 = 0;
              uVar8 = 0;
            }
            else {
              iVar33 = iVar21 + -6;
              uVar23 = 1 << ((byte)iVar33 & 0x1f);
              uVar30 = uVar23;
              if ((int)uVar23 < 2) {
                uVar30 = 1;
              }
              uVar35 = 0;
              uVar8 = 0;
              iVar32 = 0;
              do {
                bVar20 = (byte)uVar35;
                if (iVar21 < 7) {
                  bVar39 = (s_Truths6Neg[uVar35] &
                           (*pTruth >> ((byte)(1 << (bVar20 & 0x1f)) & 0x3f) ^ *pTruth)) == 0;
                }
                else {
                  bVar39 = true;
                  if (uVar35 < 6) {
                    if (iVar33 != 0x1f) {
                      lVar38 = 0;
                      do {
                        bVar39 = ((pTruth[lVar38] >> ((byte)(1 << (bVar20 & 0x1f)) & 0x3f) ^
                                  pTruth[lVar38]) & s_Truths6Neg[uVar35]) == 0;
                        if (!bVar39) break;
                        bVar40 = (ulong)uVar30 - 1 != lVar38;
                        lVar38 = lVar38 + 1;
                      } while (bVar40);
                    }
                  }
                  else if (iVar33 != 0x1f) {
                    uVar29 = (ulong)(uint)(1 << (bVar20 - 6 & 0x1f));
                    uVar28 = 2 << (bVar20 - 6 & 0x1f);
                    pwVar22 = pTruth + uVar29;
                    pwVar17 = pTruth;
                    do {
                      uVar15 = 0;
                      do {
                        if (pwVar17[uVar15] != pwVar22[uVar15]) {
                          bVar39 = false;
                          goto LAB_0023bdfe;
                        }
                        uVar15 = uVar15 + 1;
                      } while (uVar29 != uVar15);
                      pwVar17 = pwVar17 + uVar28;
                      pwVar22 = pwVar22 + uVar28;
                    } while (pwVar17 < pTruth + (int)uVar23);
                  }
                }
LAB_0023bdfe:
                uVar28 = 1 << (bVar20 & 0x1f);
                iVar32 = iVar32 + (uint)(bVar39 ^ 1);
                if (bVar39 != false) {
                  uVar28 = 0;
                }
                uVar8 = uVar8 | uVar28;
                uVar35 = uVar35 + 1;
              } while (uVar35 != uVar31);
            }
            if (uVar8 != 0) {
              if ((int)uVar8 < 1) {
                __assert_fail("Supp > 0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/utilTruth.h"
                              ,0x575,"int Abc_TtSuppIsMinBase(int)");
              }
              if ((uVar8 + 1 & uVar8) != 0) {
                if (iVar21 < 1) {
                  iVar21 = 0;
                }
                else {
                  uVar30 = 1 << ((char)iVar21 - 6U & 0x1f);
                  if (iVar21 < 7) {
                    uVar30 = 1;
                  }
                  uVar35 = 0;
                  iVar21 = 0;
                  do {
                    if ((uVar8 >> ((uint)uVar35 & 0x1f) & 1) != 0) {
                      if (iVar21 < (int)(uint)uVar35) {
                        uVar29 = uVar35;
                        do {
                          uVar15 = uVar29 - 1;
                          if ((long)uVar29 < 6) {
                            if (0 < (int)uVar30) {
                              uVar29 = s_PMasks[uVar15][0];
                              uVar3 = s_PMasks[uVar15][1];
                              uVar4 = s_PMasks[uVar15][2];
                              uVar26 = 0;
                              do {
                                uVar5 = pTruth[uVar26];
                                bVar20 = (byte)(1 << ((byte)uVar15 & 0x1f));
                                pTruth[uVar26] =
                                     (uVar5 & uVar4) >> (bVar20 & 0x3f) |
                                     (uVar5 & uVar3) << (bVar20 & 0x3f) | uVar5 & uVar29;
                                uVar26 = uVar26 + 1;
                              } while (uVar30 != uVar26);
                            }
                          }
                          else if (uVar15 == 5) {
                            pwVar17 = pTruth;
                            if (0 < (int)uVar30) {
                              do {
                                puVar1 = (ulong *)((long)pwVar17 + 4);
                                *puVar1 = *puVar1 << 0x20 | *puVar1 >> 0x20;
                                pwVar17 = pwVar17 + 2;
                              } while (pwVar17 < pTruth + (int)uVar30);
                            }
                          }
                          else if (0 < (int)uVar30) {
                            uVar23 = 1 << ((char)uVar29 - 7U & 0x1f);
                            if ((long)uVar29 < 8) {
                              uVar23 = 1;
                            }
                            iVar33 = uVar23 * 4;
                            pwVar36 = pTruth + uVar23 * 2;
                            pwVar22 = pTruth + uVar23;
                            pwVar17 = pTruth;
                            do {
                              if (0 < (int)uVar23) {
                                uVar29 = 0;
                                do {
                                  wVar6 = pwVar22[uVar29];
                                  pwVar22[uVar29] = pwVar36[uVar29];
                                  pwVar36[uVar29] = wVar6;
                                  uVar29 = uVar29 + 1;
                                } while (uVar23 != uVar29);
                              }
                              pwVar17 = pwVar17 + iVar33;
                              pwVar36 = pwVar36 + iVar33;
                              pwVar22 = pwVar22 + iVar33;
                            } while (pwVar17 < pTruth + (int)uVar30);
                          }
                          uVar29 = uVar15;
                        } while ((long)iVar21 < (long)uVar15);
                      }
                      iVar21 = iVar21 + 1;
                    }
                    uVar35 = uVar35 + 1;
                  } while (uVar35 != uVar31);
                }
                if (iVar21 != iVar32) {
                  __assert_fail("Var == nVars",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/utilTruth.h"
                                ,0x6e7,"void Abc_TtShrink(word *, int, int, unsigned int)");
                }
              }
            }
            if (iVar32 != 1) {
              if (iVar32 != 0) {
                Abc_TtCanonicize(pTruth,iVar32,local_158);
                p_00 = (Vec_Mem_t *)auStack_b8[iVar32];
                iVar21 = p_00->nEntries;
                pVVar14 = p_00->vTable;
                if (pVVar14->nSize < iVar21) {
                  uVar31 = (ulong)(pVVar14->nSize * 2 - 1);
                  while( true ) {
                    do {
                      uVar8 = (uint)uVar31;
                      uVar30 = uVar8 + 1;
                      uVar29 = (ulong)uVar30;
                      uVar35 = uVar31 & 1;
                      uVar31 = uVar29;
                    } while (uVar35 != 0);
                    if (uVar30 < 9) break;
                    iVar33 = 5;
                    while (uVar30 % (iVar33 - 2U) != 0) {
                      uVar23 = iVar33 * iVar33;
                      iVar33 = iVar33 + 2;
                      if (uVar30 < uVar23) goto LAB_0023c246;
                    }
                  }
LAB_0023c246:
                  if (pVVar14->nCap < (int)uVar30) {
                    if (pVVar14->pArray == (int *)0x0) {
                      piVar10 = (int *)malloc((long)(int)uVar30 << 2);
                    }
                    else {
                      piVar10 = (int *)realloc(pVVar14->pArray,(long)(int)uVar30 << 2);
                    }
                    pVVar14->pArray = piVar10;
                    if (piVar10 == (int *)0x0) {
                      __assert_fail("p->pArray",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                                    ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
                    }
                    pVVar14->nCap = uVar30;
                  }
                  if (uVar8 < 0x7fffffff) {
                    memset(pVVar14->pArray,0xff,uVar29 << 2);
                  }
                  pVVar14->nSize = uVar30;
                  p_00->vNexts->nSize = 0;
                  iVar33 = p_00->nEntries;
                  if ((0 < iVar33) && (pwVar17 = *p_00->ppPages, pwVar17 != (word *)0x0)) {
                    uVar8 = 1;
                    do {
                      piVar10 = Vec_MemHashLookup(p_00,pwVar17 + (long)p_00->nEntrySize *
                                                                 (long)(int)(uVar8 - 1 &
                                                                            p_00->PageMask));
                      if (*piVar10 != -1) {
                        __assert_fail("*pSpot == -1",
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecMem.h"
                                      ,0x16f,"void Vec_MemHashResize(Vec_Mem_t *)");
                      }
                      pVVar14 = p_00->vNexts;
                      *piVar10 = pVVar14->nSize;
                      Vec_IntPush(pVVar14,-1);
                      iVar33 = p_00->nEntries;
                      if (iVar33 <= (int)uVar8) break;
                      pwVar17 = p_00->ppPages[uVar8 >> ((byte)p_00->LogPageSze & 0x1f)];
                      uVar8 = uVar8 + 1;
                    } while (pwVar17 != (word *)0x0);
                  }
                  if (iVar33 != p_00->vNexts->nSize) {
                    __assert_fail("p->nEntries == Vec_IntSize(p->vNexts)",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecMem.h"
                                  ,0x173,"void Vec_MemHashResize(Vec_Mem_t *)");
                  }
                }
                puVar11 = (uint *)Vec_MemHashLookup(p_00,pTruth);
                uVar8 = *puVar11;
                if (uVar8 == 0xffffffff) {
                  pVVar14 = p_00->vNexts;
                  *puVar11 = pVVar14->nSize;
                  Vec_IntPush(pVVar14,-1);
                  uVar8 = p_00->nEntries;
                  if ((int)uVar8 < 0) {
                    __assert_fail("i >= 0",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecMem.h"
                                  ,0xd8,"word *Vec_MemGetEntry(Vec_Mem_t *, int)");
                  }
                  uVar30 = uVar8 >> ((byte)p_00->LogPageSze & 0x1f);
                  if (p_00->iPage < (int)uVar30) {
                    iVar33 = p_00->nPageAlloc;
                    if (iVar33 <= (int)uVar30) {
                      iVar24 = uVar30 + 0x20;
                      if (iVar33 != 0) {
                        iVar24 = iVar33 * 2;
                      }
                      p_00->nPageAlloc = iVar24;
                      if (p_00->ppPages == (word **)0x0) {
                        ppwVar16 = (word **)malloc((long)iVar24 * 8);
                      }
                      else {
                        ppwVar16 = (word **)realloc(p_00->ppPages,(long)iVar24 * 8);
                      }
                      p_00->ppPages = ppwVar16;
                    }
                    if (p_00->iPage < (int)uVar30) {
                      iVar33 = p_00->nEntrySize;
                      iVar24 = p_00->LogPageSze;
                      uVar31 = (long)p_00->iPage;
                      do {
                        uVar35 = uVar31 + 1;
                        pwVar17 = (word *)malloc((long)(iVar33 << ((byte)iVar24 & 0x1f)) << 3);
                        p_00->ppPages[uVar31 + 1] = pwVar17;
                        uVar31 = uVar35;
                      } while (uVar30 != uVar35);
                    }
                    p_00->iPage = uVar30;
                  }
                  p_00->nEntries = uVar8 + 1;
                  memmove(p_00->ppPages[uVar8 >> ((byte)p_00->LogPageSze & 0x1f)] +
                          (long)(int)(p_00->PageMask & uVar8) * (long)p_00->nEntrySize,pTruth,
                          (long)p_00->nEntrySize << 3);
                  iVar33 = p_00->vNexts->nSize;
                  if (p_00->nEntries != iVar33) {
                    __assert_fail("p->nEntries == Vec_IntSize(p->vNexts)",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecMem.h"
                                  ,0x180,"int Vec_MemHashInsert(Vec_Mem_t *, word *)");
                  }
                  uVar8 = iVar33 - 1;
                }
                uVar31 = (ulong)uVar8;
                if (iVar21 != p_00->nEntries) {
                  if (((int)uVar8 < 0) || (*(int *)(alStack_148[iVar32] + 4) <= (int)uVar8))
                  goto LAB_0023cac3;
                  lVar38 = *(long *)(alStack_148[iVar32] + 8);
                  if (*(int *)(lVar38 + uVar31 * 4) != -1) {
                    __assert_fail("Vec_IntEntry(vTt2Class[nVars], truthId) == -1",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaTruth.c"
                                  ,0x313,
                                  "Gia_Man_t *Gia_ManIsoNpnReduce(Gia_Man_t *, Vec_Ptr_t **, int)");
                  }
                  *(int *)(lVar38 + uVar31 * 4) = p_01->nSize;
                  Vec_WecPushLevel(p_01);
                }
                if (((int)uVar8 < 0) || (*(int *)(alStack_148[iVar32] + 4) <= (int)uVar8))
                goto LAB_0023cac3;
                iVar21 = *(int *)(*(long *)(alStack_148[iVar32] + 8) + uVar31 * 4);
                if ((long)iVar21 < 0) {
                  __assert_fail("Vec_IntEntry(vTt2Class[nVars], truthId) >= 0",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaTruth.c"
                                ,0x317,
                                "Gia_Man_t *Gia_ManIsoNpnReduce(Gia_Man_t *, Vec_Ptr_t **, int)");
                }
                if (p_01->nSize <= iVar21) {
                  uVar30 = iVar21 + 1;
                  uVar8 = p_01->nSize * 2;
                  if ((int)uVar8 <= (int)uVar30) {
                    uVar8 = uVar30;
                  }
                  if (p_01->nCap < (int)uVar8) {
                    if (p_01->pArray == (Vec_Int_t *)0x0) {
                      pVVar14 = (Vec_Int_t *)malloc((ulong)uVar8 << 4);
                    }
                    else {
                      pVVar14 = (Vec_Int_t *)realloc(p_01->pArray,(ulong)uVar8 << 4);
                    }
                    p_01->pArray = pVVar14;
                    memset(pVVar14 + p_01->nCap,0,((long)(int)uVar8 - (long)p_01->nCap) * 0x10);
                    p_01->nCap = uVar8;
                  }
                  p_01->nSize = uVar30;
                }
                if (p_01->nSize <= iVar21) goto LAB_0023cae2;
                pVVar14 = p_01->pArray + iVar21;
                goto LAB_0023c2c8;
              }
              if (uVar25 == 0xffffffff) {
                uVar25 = p_01->nSize;
                Vec_WecPushLevel(p_01);
              }
              if (p_01->nSize <= (int)uVar25) {
                iVar32 = uVar25 + 1;
                iVar21 = p_01->nSize * 2;
                if (iVar21 <= iVar32) {
                  iVar21 = iVar32;
                }
                if (p_01->nCap < iVar21) {
                  __size = (long)iVar21 << 4;
                  if (p_01->pArray == (Vec_Int_t *)0x0) {
                    pVVar14 = (Vec_Int_t *)malloc(__size);
                  }
                  else {
                    pVVar14 = (Vec_Int_t *)realloc(p_01->pArray,__size);
                  }
                  p_01->pArray = pVVar14;
                  memset(pVVar14 + p_01->nCap,0,((long)iVar21 - (long)p_01->nCap) * 0x10);
                  p_01->nCap = iVar21;
                }
                p_01->nSize = iVar32;
              }
              if (((int)uVar25 < 0) || (uVar8 = uVar25, p_01->nSize <= (int)uVar25))
              goto LAB_0023cae2;
              goto LAB_0023c2bf;
            }
            if (uVar34 == 0xffffffff) {
              uVar34 = p_01->nSize;
              Vec_WecPushLevel(p_01);
            }
            iVar21 = p_01->nSize;
            if (iVar21 <= (int)uVar34) goto LAB_0023c19c;
          }
          if (((int)uVar34 < 0) || (uVar8 = uVar34, p_01->nSize <= (int)uVar34)) {
LAB_0023cae2:
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecWec.h"
                          ,0x9c,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
          }
        }
LAB_0023c2bf:
        pVVar14 = p_01->pArray + uVar8;
      }
      else {
        pVVar14 = Vec_WecPushLevel(p_01);
      }
LAB_0023c2c8:
      Vec_IntPush(pVVar14,(int)lVar37);
      lVar37 = lVar37 + 1;
      pVVar14 = p->vCos;
      uVar31 = (ulong)pVVar14->nSize;
    } while (lVar37 < (long)(uVar31 - (long)p->nRegs));
  }
  Gia_ObjComputeTruthTableStop(p);
  if (pVVar9->pArray != (int *)0x0) {
    free(pVVar9->pArray);
    pVVar9->pArray = (int *)0x0;
  }
  free(pVVar9);
  lVar37 = 0;
  do {
    pvVar12 = (void *)auStack_b8[lVar37];
    if (pvVar12 != (void *)0x0) {
      if (*(long *)((long)pvVar12 + 0x20) != 0) {
        pvVar7 = *(void **)(*(long *)((long)pvVar12 + 0x20) + 8);
        if (pvVar7 != (void *)0x0) {
          free(pvVar7);
          *(undefined8 *)(*(long *)((long)pvVar12 + 0x20) + 8) = 0;
        }
        if (*(void **)((long)pvVar12 + 0x20) != (void *)0x0) {
          free(*(void **)((long)pvVar12 + 0x20));
          *(undefined8 *)((long)pvVar12 + 0x20) = 0;
        }
      }
      if (*(long *)((long)pvVar12 + 0x28) != 0) {
        pvVar7 = *(void **)(*(long *)((long)pvVar12 + 0x28) + 8);
        if (pvVar7 != (void *)0x0) {
          free(pvVar7);
          *(undefined8 *)(*(long *)((long)pvVar12 + 0x28) + 8) = 0;
        }
        if (*(void **)((long)pvVar12 + 0x28) != (void *)0x0) {
          free(*(void **)((long)pvVar12 + 0x28));
          *(undefined8 *)((long)pvVar12 + 0x28) = 0;
        }
      }
    }
    if (-1 < *(int *)((long)pvVar12 + 0x14)) {
      lVar38 = -1;
      do {
        pvVar7 = *(void **)(*(long *)((long)pvVar12 + 0x18) + 8 + lVar38 * 8);
        if (pvVar7 != (void *)0x0) {
          free(pvVar7);
          *(undefined8 *)(*(long *)((long)pvVar12 + 0x18) + 8 + lVar38 * 8) = 0;
        }
        lVar38 = lVar38 + 1;
      } while (lVar38 < *(int *)((long)pvVar12 + 0x14));
    }
    if (*(void **)((long)pvVar12 + 0x18) != (void *)0x0) {
      free(*(void **)((long)pvVar12 + 0x18));
      *(undefined8 *)((long)pvVar12 + 0x18) = 0;
    }
    if (pvVar12 != (void *)0x0) {
      free(pvVar12);
    }
    pvVar12 = (void *)alStack_148[lVar37];
    if (*(void **)((long)pvVar12 + 8) != (void *)0x0) {
      free(*(void **)((long)pvVar12 + 8));
      *(undefined8 *)((long)pvVar12 + 8) = 0;
    }
    if (pvVar12 != (void *)0x0) {
      free(pvVar12);
    }
    lVar37 = lVar37 + 1;
  } while (lVar37 != 0x11);
  uVar25 = p_01->nSize;
  pVVar9 = (Vec_Int_t *)malloc(0x10);
  uVar34 = 0x10;
  if (0xe < uVar25 - 1) {
    uVar34 = uVar25;
  }
  pVVar9->nSize = 0;
  pVVar9->nCap = uVar34;
  if (uVar34 == 0) {
    piVar10 = (int *)0x0;
  }
  else {
    piVar10 = (int *)malloc((long)(int)uVar34 << 2);
  }
  pVVar9->pArray = piVar10;
  if (0 < (int)uVar25) {
    pVVar14 = p_01->pArray;
    lVar37 = 0;
    do {
      if (0 < *(int *)((long)&pVVar14->nSize + lVar37)) {
        Vec_IntPush(pVVar9,**(int **)((long)&pVVar14->pArray + lVar37));
      }
      lVar37 = lVar37 + 0x10;
    } while ((ulong)uVar25 << 4 != lVar37);
  }
  piVar10 = pVVar9->pArray;
  pGVar18 = Gia_ManDupCones(p,piVar10,pVVar9->nSize,0);
  if (piVar10 != (int *)0x0) {
    free(piVar10);
    pVVar9->pArray = (int *)0x0;
  }
  free(pVVar9);
  if ((fVerbose != 0) && (puts("Nontrivial classes:"), 0 < (int)uVar25)) {
    pVVar9 = p_01->pArray;
    uVar31 = 0;
    do {
      if (pVVar9[uVar31].nSize != 1) {
        printf(" %4d : {",uVar31 & 0xffffffff);
        if (0 < pVVar9[uVar31].nSize) {
          lVar37 = 0;
          do {
            printf(" %d",(ulong)(uint)pVVar9[uVar31].pArray[lVar37]);
            lVar37 = lVar37 + 1;
          } while (lVar37 < pVVar9[uVar31].nSize);
        }
        puts(" }");
      }
      uVar31 = uVar31 + 1;
    } while (uVar31 != uVar25);
  }
  if (local_160 != (Vec_Ptr_t **)0x0) {
    pVVar19 = (Vec_Ptr_t *)malloc(0x10);
    uVar34 = 8;
    if (6 < uVar25 - 1) {
      uVar34 = uVar25;
    }
    pVVar19->nSize = 0;
    pVVar19->nCap = uVar34;
    if (uVar34 == 0) {
      __ptr = (void **)0x0;
    }
    else {
      __ptr = (void **)malloc((long)(int)uVar34 << 3);
    }
    pVVar19->pArray = __ptr;
    if (0 < (int)uVar25) {
      lVar38 = 1;
      lVar37 = 0;
      do {
        pVVar9 = p_01->pArray;
        piVar10 = (int *)malloc(0x10);
        iVar21 = *(int *)((long)pVVar9 + lVar38 * 8 + -4);
        lVar27 = (long)iVar21;
        piVar10[1] = iVar21;
        *piVar10 = iVar21;
        if (lVar27 == 0) {
          pvVar12 = (void *)0x0;
        }
        else {
          pvVar12 = malloc(lVar27 * 4);
        }
        *(void **)(piVar10 + 2) = pvVar12;
        memcpy(pvVar12,*(void **)(&pVVar9->nCap + lVar38 * 2),lVar27 << 2);
        if ((uint)lVar37 == uVar34) {
          if ((int)uVar34 < 0x10) {
            if (__ptr == (void **)0x0) {
              __ptr = (void **)malloc(0x80);
            }
            else {
              __ptr = (void **)realloc(__ptr,0x80);
            }
            uVar34 = 0x10;
          }
          else {
            uVar25 = uVar34 * 2;
            if (SBORROW4(uVar34,uVar25) != 0 < (int)uVar34) {
              uVar34 = uVar25;
              if (__ptr == (void **)0x0) {
                __ptr = (void **)malloc((ulong)uVar25 << 3);
              }
              else {
                __ptr = (void **)realloc(__ptr,(ulong)uVar25 << 3);
              }
            }
          }
        }
        __ptr[lVar37] = piVar10;
        lVar37 = lVar37 + 1;
        lVar38 = lVar38 + 2;
      } while (lVar37 < p_01->nSize);
      pVVar19->nSize = (int)lVar37;
      pVVar19->nCap = uVar34;
      pVVar19->pArray = __ptr;
    }
    *local_160 = pVVar19;
  }
  iVar21 = p_01->nCap;
  if (0 < (long)iVar21) {
    pVVar9 = p_01->pArray;
    lVar37 = 0;
    do {
      pvVar12 = *(void **)((long)&pVVar9->pArray + lVar37);
      if (pvVar12 != (void *)0x0) {
        free(pvVar12);
        *(undefined8 *)((long)&pVVar9->pArray + lVar37) = 0;
      }
      lVar37 = lVar37 + 0x10;
    } while ((long)iVar21 * 0x10 != lVar37);
  }
  if (p_01->pArray != (Vec_Int_t *)0x0) {
    free(p_01->pArray);
    p_01->pArray = (Vec_Int_t *)0x0;
  }
  p_01->nCap = 0;
  p_01->nSize = 0;
  free(p_01);
  return pGVar18;
}

Assistant:

Gia_Man_t * Gia_ManIsoNpnReduce( Gia_Man_t * p, Vec_Ptr_t ** pvPosEquivs, int fVerbose )
{
    char pCanonPerm[16];
    int i, iObj, uCanonPhase, nVars, lastId, truthId;
    int IndexCon = -1, IndexVar = -1;
    Vec_Wec_t * vPosEquivs = Vec_WecAlloc( 100 );
    word * pTruth;
    Gia_Obj_t * pObj;
    Vec_Mem_t * vTtMem[17];   // truth table memory and hash table
    Gia_Man_t * pNew = NULL;
    Vec_Int_t * vLeaves = Vec_IntAlloc( 16 );
    Vec_Int_t * vFirsts;
    Vec_Int_t * vTt2Class[17];
    for ( i = 0; i < 17; i++ )
    {
        vTtMem[i] = Vec_MemAlloc( Abc_TtWordNum(i), 10 );
        Vec_MemHashAlloc( vTtMem[i], 1000 );
        vTt2Class[i] = Vec_IntStartFull( Gia_ManCoNum(p)+1 );
    }
    Gia_ObjComputeTruthTableStart( p, 16 );
    Gia_ManForEachPo( p, pObj, i )
    {
        iObj = Gia_ObjId(p, pObj);
        Gia_ManCollectCis( p, &iObj, 1, vLeaves );
        if ( Vec_IntSize(vLeaves) > 16 )
        {
            Vec_IntPush( Vec_WecPushLevel(vPosEquivs), i );
            continue;
        }
        pObj = Gia_ObjFanin0(pObj);
        if ( Gia_ObjIsConst0(pObj) )
        {
            if ( IndexCon == -1 )
            {
                IndexCon = Vec_WecSize(vPosEquivs);
                Vec_WecPushLevel(vPosEquivs);
            }
            Vec_WecPush( vPosEquivs, IndexCon, i );
            continue;
        }
        if ( Gia_ObjIsCi(pObj) )
        {
            if ( IndexVar == -1 )
            {
                IndexVar = Vec_WecSize(vPosEquivs);
                Vec_WecPushLevel(vPosEquivs);
            }
            Vec_WecPush( vPosEquivs, IndexVar, i );
            continue;
        }
        assert( Gia_ObjIsAnd(pObj) );
        pTruth = Gia_ObjComputeTruthTableCut( p, pObj, vLeaves );
        Abc_TtMinimumBase( pTruth, NULL, Vec_IntSize(vLeaves), &nVars );
        if ( nVars == 0 )
        {
            if ( IndexCon == -1 )
            {
                IndexCon = Vec_WecSize(vPosEquivs);
                Vec_WecPushLevel(vPosEquivs);
            }
            Vec_WecPush( vPosEquivs, IndexCon, i );
            continue;
        }
        if ( nVars == 1 )
        {
            if ( IndexVar == -1 )
            {
                IndexVar = Vec_WecSize(vPosEquivs);
                Vec_WecPushLevel(vPosEquivs);
            }
            Vec_WecPush( vPosEquivs, IndexVar, i );
            continue;
        }
        uCanonPhase = Abc_TtCanonicize( pTruth, nVars, pCanonPerm );
        lastId = Vec_MemEntryNum( vTtMem[nVars] );
        truthId = Vec_MemHashInsert( vTtMem[nVars], pTruth );
        if ( lastId != Vec_MemEntryNum( vTtMem[nVars] ) ) // new one
        {
            assert( Vec_IntEntry(vTt2Class[nVars], truthId) == -1 );
            Vec_IntWriteEntry( vTt2Class[nVars], truthId, Vec_WecSize(vPosEquivs) );
            Vec_WecPushLevel(vPosEquivs);
        }
        assert( Vec_IntEntry(vTt2Class[nVars], truthId) >= 0 );
        Vec_WecPush( vPosEquivs, Vec_IntEntry(vTt2Class[nVars], truthId), i );
    }
    Gia_ObjComputeTruthTableStop( p );
    Vec_IntFree( vLeaves );
    for ( i = 0; i < 17; i++ )
    {
        Vec_MemHashFree( vTtMem[i] );
        Vec_MemFree( vTtMem[i] );
        Vec_IntFree( vTt2Class[i] );
    }

    // find the first outputs and derive GIA
    vFirsts = Vec_WecCollectFirsts( vPosEquivs );
    pNew = Gia_ManDupCones( p, Vec_IntArray(vFirsts), Vec_IntSize(vFirsts), 0 );
    Vec_IntFree( vFirsts );
    // report and return    
    if ( fVerbose )
    { 
        printf( "Nontrivial classes:\n" );
        Vec_WecPrint( vPosEquivs, 1 );
    }
    if ( pvPosEquivs )
        *pvPosEquivs = Vec_WecConvertToVecPtr( vPosEquivs );
    Vec_WecFree( vPosEquivs );
    return pNew;
}